

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_get_combined_image_samplers
          (spvc_compiler compiler,spvc_combined_image_sampler **samplers,size_t *num_samplers)

{
  ScratchMemoryAllocation *pSVar1;
  pointer *__ptr;
  CombinedImageSampler *c;
  CombinedImageSampler *pCVar2;
  long lVar3;
  spvc_combined_image_sampler local_158;
  size_t *local_148;
  SmallVector<spvc_combined_image_sampler,_8UL> translated;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> combined;
  
  local_148 = num_samplers;
  spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::SmallVector
            (&combined,
             &((compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl)->
              combined_image_samplers);
  translated.super_VectorView<spvc_combined_image_sampler>.ptr =
       (spvc_combined_image_sampler *)&translated.stack_storage;
  translated.super_VectorView<spvc_combined_image_sampler>.buffer_size = 0;
  translated.buffer_capacity = 8;
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::reserve
            (&translated,combined.super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size);
  pCVar2 = combined.super_VectorView<spirv_cross::CombinedImageSampler>.ptr;
  for (lVar3 = combined.super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size * 0xc;
      lVar3 != 0; lVar3 = lVar3 + -0xc) {
    local_158._0_8_ = *(undefined8 *)pCVar2;
    local_158.sampler_id = (pCVar2->sampler_id).id;
    spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::push_back(&translated,&local_158);
    pCVar2 = pCVar2 + 1;
  }
  pSVar1 = (ScratchMemoryAllocation *)operator_new(0x80);
  pSVar1[0xe]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[0xf]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[0xc]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[0xd]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[10]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[0xb]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[8]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[9]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[6]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[7]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[4]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[5]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1->_vptr_ScratchMemoryAllocation = (_func_int **)&PTR__TemporaryBuffer_0039db50;
  pSVar1[2]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[1]._vptr_ScratchMemoryAllocation = (_func_int **)(pSVar1 + 4);
  pSVar1[3]._vptr_ScratchMemoryAllocation = (_func_int **)0x8;
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::operator=
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)(pSVar1 + 1),&translated);
  *samplers = (spvc_combined_image_sampler *)pSVar1[1]._vptr_ScratchMemoryAllocation;
  *local_148 = (size_t)pSVar1[2]._vptr_ScratchMemoryAllocation;
  local_158._0_8_ = pSVar1;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&compiler->context->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &local_158);
  if ((ScratchMemoryAllocation *)local_158._0_8_ != (ScratchMemoryAllocation *)0x0) {
    (*(*(_func_int ***)local_158._0_8_)[1])();
  }
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::~SmallVector(&translated);
  spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::~SmallVector(&combined);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_combined_image_samplers(spvc_compiler compiler,
                                                      const spvc_combined_image_sampler **samplers,
                                                      size_t *num_samplers)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto combined = compiler->compiler->get_combined_image_samplers();
		SmallVector<spvc_combined_image_sampler> translated;
		translated.reserve(combined.size());
		for (auto &c : combined)
		{
			spvc_combined_image_sampler trans = { c.combined_id, c.image_id, c.sampler_id };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_combined_image_sampler>>();
		ptr->buffer = std::move(translated);
		*samplers = ptr->buffer.data();
		*num_samplers = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}